

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O3

void __thiscall RigidBodyDynamics::Model::SetBodyInertia(Model *this,uint id,Matrix3d *inertia)

{
  pointer pFVar1;
  double *pdVar2;
  uint uVar3;
  pointer pFVar4;
  pointer pBVar5;
  double dVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Matrix3d *pMVar10;
  Matrix3d *pMVar11;
  Matrix3d *pMVar12;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator;
  byte bVar13;
  Body local_a0;
  
  bVar13 = 0;
  uVar7 = (ulong)(id - this->fixed_body_discriminator);
  if ((id == 0xffffffff || id < this->fixed_body_discriminator) ||
     (pFVar4 = (this->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start,
     uVar9 = ((long)(this->mFixedBodies).
                    super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    .
                    super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 4) *
             -0x79435e50d79435e5, uVar9 < uVar7 || uVar9 - uVar7 == 0)) {
    pBVar5 = (this->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1];
    *(double *)&pBVar5[id].mInertia.super_Matrix3d =
         (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    *(double *)((long)&pBVar5[id].mInertia.super_Matrix3d + 8) = dVar6;
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3];
    pdVar2 = (double *)((long)&pBVar5[id].mInertia.super_Matrix3d + 0x10);
    *pdVar2 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              .m_storage.m_data.array[2];
    pdVar2[1] = dVar6;
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5];
    pdVar2 = (double *)((long)&pBVar5[id].mInertia.super_Matrix3d + 0x20);
    *pdVar2 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              .m_storage.m_data.array[4];
    pdVar2[1] = dVar6;
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[7];
    pdVar2 = (double *)((long)&pBVar5[id].mInertia.super_Matrix3d + 0x30);
    *pdVar2 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              .m_storage.m_data.array[6];
    pdVar2[1] = dVar6;
    *(double *)((long)&pBVar5[id].mInertia.super_Matrix3d + 0x40) =
         (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[8];
  }
  else {
    uVar3 = pFVar4[uVar7].mMovableParent;
    pBVar5 = (this->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar1 = pFVar4 + uVar7;
    pMVar11 = &pFVar1->mInertia;
    local_a0.mMass = pFVar1->mMass;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          &(pFVar1->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 8);
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 0x10);
    pMVar10 = pMVar11;
    pMVar12 = &local_a0.mInertia;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pMVar12->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &(pMVar10->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar10 = (Matrix3d *)
                ((long)&(pMVar10->super_Matrix3d).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> + 8);
      pMVar12 = (Matrix3d *)
                ((pMVar12->super_Matrix3d).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                + 1);
    }
    local_a0.mIsVirtual = false;
    Body::Separate(pBVar5 + uVar3,&pFVar4[uVar7].mParentTransform,&local_a0);
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1];
    *(double *)
     &(pMVar11->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> =
         (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 8) = dVar6;
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3];
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 0x10) =
         (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[2];
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 0x18) = dVar6;
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5];
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 0x20) =
         (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[4];
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 0x28) = dVar6;
    dVar6 = (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[7];
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 0x30) =
         (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[6];
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 0x38) = dVar6;
    *(double *)((long)&(pFVar1->mInertia).super_Matrix3d + 0x40) =
         (inertia->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[8];
    uVar3 = pFVar1->mMovableParent;
    pBVar5 = (this->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a0.mMass = pFVar1->mMass;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          &(pFVar1->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 8);
    local_a0.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&(pFVar1->mCenterOfMass).super_Vector3d + 0x10);
    pMVar10 = &local_a0.mInertia;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pMVar10->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &(pMVar11->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar13 * -2 + 1) * 8);
      pMVar10 = (Matrix3d *)((long)pMVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    local_a0.mIsVirtual = false;
    Body::Join(pBVar5 + uVar3,&pFVar4[uVar7].mParentTransform,&local_a0);
  }
  UpdateInertiaMatrixForBody(this,id);
  return;
}

Assistant:

void Model::SetBodyInertia(const unsigned int id, const Math::Matrix3d &inertia)
{
  if(IsFixedBodyId(id))
  {
    // The inertial parameters of the fixed body have already been merged in the parent body,
    // in order to update correctly the parent body we need to first
    // remove the inertial effects of the fixed body from his parent body
    // Then update the fixed body inertia
    // Finally, merge it again in the parent body
    FixedBody& fixedbody(mFixedBodies[id - fixed_body_discriminator]);
    mBodies[fixedbody.mMovableParent].Separate(fixedbody.mParentTransform, fixedbody.ToBody());
    fixedbody.mInertia = inertia;
    mBodies[fixedbody.mMovableParent].Join(fixedbody.mParentTransform, fixedbody.ToBody());
  }
  else
  {
    mBodies[id].mInertia = inertia;
  }
  UpdateInertiaMatrixForBody(id);
}